

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstring.hpp
# Opt level: O2

void __thiscall
xll::basic_pstring<wchar_t>::internal_copy(basic_pstring<wchar_t> *this,wchar_t *s,size_type n)

{
  wchar_t *pwVar1;
  
  pwVar1 = (wchar_t *)operator_new((ulong)(n + 1) << 2);
  this->data_ = pwVar1;
  *pwVar1 = n;
  if (n != 0 && s != (wchar_t *)0x0) {
    memcpy(pwVar1 + 1,s,(ulong)n << 2);
    return;
  }
  return;
}

Assistant:

inline void internal_copy(const CharT *s, size_type n)
    {
        std::size_t nbytes = (n + 1) * sizeof(CharT);
        data_ = static_cast<CharT *>(::operator new (nbytes)); // allocate
        data_[0] = n;
        if (s != nullptr && n > 0)
            std::copy_n(s, n, &data_[1]);
    }